

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int cvLsInitializeCounters(CVLsMem cvls_mem)

{
  cvls_mem->ncfl = 0;
  cvls_mem->njtsetup = 0;
  cvls_mem->nli = 0;
  cvls_mem->nps = 0;
  cvls_mem->nstlj = 0;
  cvls_mem->npe = 0;
  cvls_mem->nje = 0;
  cvls_mem->nfeDQ = 0;
  cvls_mem->njtimes = 0;
  return 0;
}

Assistant:

int cvLsInitializeCounters(CVLsMem cvls_mem)
{
  cvls_mem->nje      = 0;
  cvls_mem->nfeDQ    = 0;
  cvls_mem->nstlj    = 0;
  cvls_mem->npe      = 0;
  cvls_mem->nli      = 0;
  cvls_mem->nps      = 0;
  cvls_mem->ncfl     = 0;
  cvls_mem->njtsetup = 0;
  cvls_mem->njtimes  = 0;
  return (0);
}